

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzmaEnc.cpp
# Opt level: O1

UInt32 crnlib::GetPureRepPrice(CLzmaEnc *p,UInt32 repIndex,UInt32 state,UInt32 posState)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = (uint)(p->isRepG0[state] >> 4);
  if (repIndex == 0) {
    return *(int *)((long)p->ProbPrices +
                   (ulong)(p->isRep0Long[state][posState] >> 2 & 0xfffffffc ^ 0x1fc)) +
           p->ProbPrices[uVar2];
  }
  uVar1 = (uint)(p->isRepG1[state] >> 4);
  if (repIndex == 1) {
    return p->ProbPrices[uVar2 ^ 0x7f] + p->ProbPrices[uVar1];
  }
  return p->ProbPrices[uVar2 ^ 0x7f] + p->ProbPrices[uVar1 ^ 0x7f] +
         *(int *)((long)p->ProbPrices +
                 (ulong)((2 - repIndex & 0x7f0 ^ (uint)p->isRepG2[state]) >> 2 & 0x3ffc));
}

Assistant:

static UInt32 GetPureRepPrice(CLzmaEnc* p, UInt32 repIndex, UInt32 state, UInt32 posState) {
  UInt32 price;
  if (repIndex == 0) {
    price = GET_PRICE_0(p->isRepG0[state]);
    price += GET_PRICE_1(p->isRep0Long[state][posState]);
  } else {
    price = GET_PRICE_1(p->isRepG0[state]);
    if (repIndex == 1)
      price += GET_PRICE_0(p->isRepG1[state]);
    else {
      price += GET_PRICE_1(p->isRepG1[state]);
      price += GET_PRICE(p->isRepG2[state], repIndex - 2);
    }
  }
  return price;
}